

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_30::AsyncStreamFd::setsockopt
          (AsyncStreamFd *this,int __fd,int __level,int __optname,void *__optval,socklen_t __optlen)

{
  int osErrorNumber;
  void *pvVar1;
  undefined4 in_register_0000000c;
  Fault local_58;
  Fault f;
  SyscallResult local_28;
  undefined4 local_24;
  SyscallResult _kjSyscallResult;
  uint length_local;
  void *value_local;
  int option_local;
  int level_local;
  AsyncStreamFd *this_local;
  
  __kjSyscallResult = CONCAT44(in_register_0000000c,__optname);
  local_24 = SUB84(__optval,0);
  f.exception = (Exception *)this;
  local_28 = _::Debug::
             syscall<kj::(anonymous_namespace)::AsyncStreamFd::setsockopt(int,int,void_const*,unsigned_int)::_lambda()_1_>
                       ((anon_class_40_5_81088712 *)&f,false);
  pvVar1 = _::Debug::SyscallResult::operator_cast_to_void_(&local_28);
  if (pvVar1 != (void *)0x0) {
    return (int)pvVar1;
  }
  osErrorNumber = _::Debug::SyscallResult::getErrorNumber(&local_28);
  _::Debug::Fault::Fault
            (&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0xd4,osErrorNumber,"::setsockopt(fd, level, option, value, length)","");
  _::Debug::Fault::fatal(&local_58);
}

Assistant:

void setsockopt(int level, int option, const void* value, uint length) override {
    KJ_SYSCALL(::setsockopt(fd, level, option, value, length));
  }